

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_binning_array_unaligned.h
# Opt level: O2

LinearSpace3fa * __thiscall
embree::sse2::UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL>::computeAlignedSpace
          (LinearSpace3fa *__return_storage_ptr__,
          UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL> *this,range<unsigned_long> *set)

{
  uint uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  unsigned_long uVar9;
  float fVar10;
  float fVar11;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar14;
  undefined1 auVar18 [12];
  float fVar20;
  float fVar21;
  undefined1 auVar19 [16];
  float fVar22;
  float fVar23;
  vfloat4 a;
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  Vec3fa axis1;
  
  uVar9 = set->_begin;
  uVar7 = uVar9 << 5 | 0x1c;
  uVar8 = 0xffffffffffffffff;
  local_68 = 0.0;
  fStack_64 = 0.0;
  fStack_60 = 1.0;
  fStack_5c = 0.0;
  for (; uVar9 < set->_end; uVar9 = uVar9 + 1) {
    uVar1 = *(uint *)((long)this->prims + (uVar7 - 0x10));
    uVar6 = CONCAT44(*(undefined4 *)((long)&(this->prims->lower).field_0 + uVar7),uVar1);
    if (uVar6 < uVar8) {
      (*(((this->scene->geometries).items[uVar1].ptr)->super_RefCount)._vptr_RefCount[0x37])(&axis1)
      ;
      fVar15 = axis1.field_0.m128[1] * axis1.field_0.m128[1];
      fVar16 = axis1.field_0.m128[2] * axis1.field_0.m128[2];
      fVar17 = axis1.field_0.m128[3] * axis1.field_0.m128[3];
      fVar10 = fVar15 + axis1.field_0.m128[0] * axis1.field_0.m128[0] + fVar16;
      fVar11 = fVar15 + fVar15 + fVar17;
      fVar16 = fVar15 + fVar16 + fVar16;
      fVar17 = fVar15 + fVar17 + fVar17;
      if (1e-18 < fVar10) {
        auVar12._4_4_ = fVar11;
        auVar12._0_4_ = fVar10;
        auVar12._8_4_ = fVar16;
        auVar12._12_4_ = fVar17;
        auVar3._4_4_ = fVar11;
        auVar3._0_4_ = fVar10;
        auVar3._8_4_ = fVar16;
        auVar3._12_4_ = fVar17;
        auVar13 = rsqrtss(auVar12,auVar3);
        fVar11 = auVar13._0_4_;
        fStack_5c = fVar11 * fVar11 * fVar10 * -0.5 * fVar11 + fVar11 * 1.5;
        local_68 = axis1.field_0.m128[0] * fStack_5c;
        fStack_64 = axis1.field_0.m128[1] * fStack_5c;
        fStack_60 = axis1.field_0.m128[2] * fStack_5c;
        fStack_5c = axis1.field_0.m128[3] * fStack_5c;
        uVar8 = uVar6;
      }
    }
    uVar7 = uVar7 + 0x20;
  }
  fVar11 = -fStack_64;
  fVar10 = -fStack_60;
  auVar18._8_4_ = 0xffffffff;
  auVar18._0_8_ = 0xffffffffffffffff;
  if (fVar11 * fVar11 + fStack_60 * fStack_60 + 0.0 <= local_68 * local_68 + fVar10 * fVar10 + 0.0)
  {
    auVar18 = SUB1612((undefined1  [16])0x0,0);
  }
  fVar16 = (float)((uint)fStack_60 & auVar18._4_4_);
  fVar10 = (float)(~auVar18._0_4_ & (uint)fVar10);
  fVar15 = (float)(~auVar18._8_4_ & (uint)local_68 | (uint)fVar11 & auVar18._8_4_);
  fVar11 = fVar16 * fVar16;
  fVar17 = fVar15 * fVar15;
  fVar22 = fVar11 + fVar10 * fVar10 + fVar17;
  fVar23 = fVar11 + fVar11 + 0.0;
  fVar17 = fVar11 + fVar17 + fVar17;
  fVar11 = fVar11 + 0.0 + 0.0;
  auVar24._4_4_ = fVar23;
  auVar24._0_4_ = fVar22;
  auVar24._8_4_ = fVar17;
  auVar24._12_4_ = fVar11;
  auVar13._4_4_ = fVar23;
  auVar13._0_4_ = fVar22;
  auVar13._8_4_ = fVar17;
  auVar13._12_4_ = fVar11;
  auVar13 = rsqrtss(auVar24,auVar13);
  fVar11 = auVar13._0_4_;
  fVar11 = fVar11 * 1.5 - fVar11 * fVar11 * fVar22 * 0.5 * fVar11;
  fVar10 = fVar11 * fVar10;
  fVar16 = fVar11 * fVar16;
  fVar15 = fVar11 * fVar15;
  fVar17 = fVar16 * local_68 - fStack_64 * fVar10;
  fVar22 = fVar15 * fStack_64 - fStack_60 * fVar16;
  fVar23 = fVar10 * fStack_60 - local_68 * fVar15;
  fVar21 = fVar11 * 0.0 * fStack_5c - fStack_5c * fVar11 * 0.0;
  fVar11 = fVar22 * fVar22;
  fVar20 = fVar23 * fVar23;
  fVar21 = fVar21 * fVar21;
  fVar25 = fVar20 + fVar11 + fVar17 * fVar17;
  fVar26 = fVar21 + fVar11 + fVar11;
  fVar20 = fVar20 + fVar11 + fVar20;
  fVar21 = fVar21 + fVar11 + fVar21;
  auVar19._4_4_ = fVar26;
  auVar19._0_4_ = fVar25;
  auVar19._8_4_ = fVar20;
  auVar19._12_4_ = fVar21;
  auVar5._4_4_ = fVar26;
  auVar5._0_4_ = fVar25;
  auVar5._8_4_ = fVar20;
  auVar5._12_4_ = fVar21;
  auVar13 = rsqrtss(auVar19,auVar5);
  fVar11 = auVar13._0_4_;
  fVar11 = fVar11 * 1.5 - fVar11 * fVar11 * fVar25 * 0.5 * fVar11;
  aVar14.m128[1] = fVar11 * fVar23;
  aVar14.m128[0] = fVar16;
  aVar14.m128[2] = fStack_64;
  aVar14.m128[3] = 0.0;
  aVar2.m128[1] = fVar11 * fVar22;
  aVar2.m128[0] = fVar10;
  aVar2.m128[2] = local_68;
  aVar2.m128[3] = 0.0;
  (__return_storage_ptr__->vx).field_0 = aVar2;
  (__return_storage_ptr__->vy).field_0 = aVar14;
  aVar4.m128[1] = fVar11 * fVar17;
  aVar4.m128[0] = fVar15;
  aVar4.m128[2] = fStack_60;
  aVar4.m128[3] = 0.0;
  (__return_storage_ptr__->vz).field_0 = aVar4;
  return __return_storage_ptr__;
}

Assistant:

const LinearSpace3fa computeAlignedSpace(const range<size_t>& set)
        {
          Vec3fa axis(0,0,1);
          uint64_t bestGeomPrimID = -1;

          /*! find curve with minimum ID that defines valid direction */
          for (size_t i=set.begin(); i<set.end(); i++)
          {
            const unsigned int geomID = prims[i].geomID();
            const unsigned int primID = prims[i].primID();
            const uint64_t geomprimID = prims[i].ID64();
            if (geomprimID >= bestGeomPrimID) continue;
            const Vec3fa axis1 = scene->get(geomID)->computeDirection(primID);
            if (sqr_length(axis1) > 1E-18f) {
              axis = normalize(axis1);
              bestGeomPrimID = geomprimID;
            }
          }
          return frame(axis).transposed();
        }